

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpull.c
# Opt level: O0

void nn_xpull_rm(nn_sockbase *self,nn_pipe *pipe)

{
  nn_fq *self_00;
  nn_pipe *in_RSI;
  nn_fq_data *in_RDI;
  nn_xpull_data *data;
  nn_xpull *xpull;
  
  if (in_RDI == (nn_fq_data *)0x0) {
    in_RDI = (nn_fq_data *)0x0;
  }
  self_00 = (nn_fq *)nn_pipe_getdata(in_RSI);
  nn_fq_rm(self_00,in_RDI);
  nn_free((void *)0x13ce6e);
  return;
}

Assistant:

static void nn_xpull_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xpull *xpull;
    struct nn_xpull_data *data;

    xpull = nn_cont (self, struct nn_xpull, sockbase);
    data = nn_pipe_getdata (pipe);
    nn_fq_rm (&xpull->fq, &data->fq);
    nn_free (data);
}